

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O2

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint8 value)

{
  deUint8 val;
  
  val = value ^ 0x8c;
  SeedBuilder::feed(builder,1,&val);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint8 value)
{
	const deUint8 val = value ^ 140u;

	builder.feed(sizeof(val), &val);
	return builder;
}